

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O0

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char **ppcVar6;
  char *pcVar7;
  int *in_RCX;
  gengetopt_args_info *in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  gengetopt_args_info *in_R8;
  int found_prog_name;
  int i;
  int option_index;
  int optopt;
  int opterr;
  int optind;
  char *optarg;
  int check_ambiguity;
  int check_required;
  int initialize;
  int override;
  gengetopt_args_info local_args_info;
  int error_occurred;
  int c;
  char *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  int in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  int in_stack_fffffffffffffd14;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  gengetopt_args_info *in_stack_fffffffffffffd38;
  gengetopt_args_info *in_stack_fffffffffffffd40;
  gengetopt_args_info *local_2a0;
  int local_27c;
  int local_274;
  int local_270;
  int local_26c;
  char *local_268;
  char **in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  uint *in_stack_fffffffffffffdf0;
  uint *in_stack_fffffffffffffdf8;
  char **in_stack_fffffffffffffe00;
  void *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe20;
  cmdline_parser_arg_type in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  char in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  int local_40;
  
  local_40 = 0;
  package_name = (char *)*in_RSI;
  iVar5 = *in_RCX;
  iVar1 = in_RCX[2];
  iVar2 = in_RCX[3];
  if (in_RCX[1] != 0) {
    cmdline_parser_init((gengetopt_args_info *)0x142a9c);
  }
  cmdline_parser_init((gengetopt_args_info *)0x142aa9);
  local_268 = (char *)0x0;
  local_26c = 0;
  local_270 = in_RCX[4];
  local_274 = 0x3f;
LAB_00142add:
  do {
    custom_optarg = local_268;
    custom_optind = local_26c;
    custom_opterr = local_270;
    custom_optopt = local_274;
    uVar3 = custom_getopt_long(in_stack_fffffffffffffd14,
                               (char **)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08
                                                ),
                               (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)
                               ,(option *)in_stack_fffffffffffffcf8,(int *)0x142b48);
    iVar4 = custom_optind;
    local_268 = custom_optarg;
    local_26c = custom_optind;
    local_270 = custom_opterr;
    local_274 = custom_optopt;
    if (uVar3 == 0xffffffff) {
      if (1 < in_RDX->sequentialProps_group_counter) {
        in_stack_fffffffffffffd40 = in_R8;
        if (in_R8 == (gengetopt_args_info *)0x0) {
          in_stack_fffffffffffffd40 = (gengetopt_args_info *)0x30744a;
        }
        fprintf(_stderr,"%s: %d options of group sequentialProps were given. One is required%s.\n",
                *in_RSI,(ulong)(uint)in_RDX->sequentialProps_group_counter,in_stack_fffffffffffffd40
               );
        local_40 = 1;
      }
      if (iVar1 != 0) {
        iVar5 = cmdline_parser_required2
                          (in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                           (char *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        local_40 = iVar5 + local_40;
      }
      cmdline_parser_release
                ((gengetopt_args_info *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      if (local_40 != 0) {
        return 1;
      }
      if (iVar4 < in_EDI) {
        local_27c = 0;
        in_RDX->inputs_num = in_EDI - iVar4;
        ppcVar6 = (char **)malloc((ulong)in_RDX->inputs_num << 3);
        in_RDX->inputs = ppcVar6;
        while (local_26c < in_EDI) {
          local_26c = local_26c + 1;
          pcVar7 = gengetopt_strdup(in_stack_fffffffffffffcf8);
          in_RDX->inputs[local_27c] = pcVar7;
          local_27c = local_27c + 1;
        }
      }
      return 0;
    }
    switch(uVar3) {
    case 0:
      iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"sele1");
      if (iVar4 == 0) {
        in_stack_fffffffffffffcf8 = (char *)0x0;
        in_stack_fffffffffffffd00 = 1;
        in_stack_fffffffffffffd30 = 0x2d;
        in_stack_fffffffffffffd08 = iVar2;
        in_stack_fffffffffffffd38 = in_R8;
        iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                           in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                           in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                           in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                           in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                           in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                           in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                           in_stack_fffffffffffffe60);
      }
      else {
        iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"sele2");
        if (iVar4 == 0) {
          in_stack_fffffffffffffcf8 = (char *)0x0;
          in_stack_fffffffffffffd00 = 1;
          in_stack_fffffffffffffd30 = 0x2d;
          in_stack_fffffffffffffd08 = iVar2;
          in_stack_fffffffffffffd38 = in_R8;
          iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                             in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                             in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                             in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                             in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                             in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                             in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                             in_stack_fffffffffffffe60);
        }
        else {
          iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"nbins_z");
          if (iVar4 == 0) {
            in_stack_fffffffffffffcf8 = "100";
            in_stack_fffffffffffffd00 = 2;
            in_stack_fffffffffffffd30 = 0x2d;
            in_stack_fffffffffffffd08 = iVar2;
            in_stack_fffffffffffffd38 = in_R8;
            iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                               in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                               in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                               in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                               in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                               in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                               in_stack_fffffffffffffe60);
          }
          else {
            iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"privilegedAxis");
            if (iVar4 == 0) {
              in_stack_fffffffffffffcf8 = "z";
              in_stack_fffffffffffffd00 = 4;
              in_stack_fffffffffffffd30 = 0x2d;
              in_stack_fffffffffffffd08 = iVar2;
              in_stack_fffffffffffffd38 = in_R8;
              iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                                 in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                 in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                                 in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                                 in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                                 in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                                 in_stack_fffffffffffffe60);
            }
            else {
              iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"threshDens");
              if (iVar4 == 0) {
                in_stack_fffffffffffffcf8 = (char *)0x0;
                in_stack_fffffffffffffd00 = 3;
                in_stack_fffffffffffffd30 = 0x2d;
                in_stack_fffffffffffffd08 = iVar2;
                in_stack_fffffffffffffd38 = in_R8;
                iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                                   in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                   in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                                   in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                                   in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                                   in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                                   in_stack_fffffffffffffe60);
              }
              else {
                iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"bufferLength");
                if (iVar4 == 0) {
                  in_stack_fffffffffffffcf8 = (char *)0x0;
                  in_stack_fffffffffffffd00 = 3;
                  in_stack_fffffffffffffd30 = 0x2d;
                  in_stack_fffffffffffffd08 = iVar2;
                  in_stack_fffffffffffffd38 = in_R8;
                  iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                                     in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                     in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                                     in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                                     in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                                     in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                                     in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                                     in_stack_fffffffffffffe60);
                }
                else {
                  iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"rcut");
                  if (iVar4 == 0) {
                    in_stack_fffffffffffffcf8 = (char *)0x0;
                    in_stack_fffffffffffffd00 = 3;
                    in_stack_fffffffffffffd30 = 0x2d;
                    in_stack_fffffffffffffd08 = iVar2;
                    in_stack_fffffffffffffd38 = in_R8;
                    iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                                       in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                       in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                                       in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                                       in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                                       in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                                       in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                                       in_stack_fffffffffffffe60);
                  }
                  else {
                    iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"deltaCount");
                    if (iVar4 == 0) {
                      if ((in_RDX->sequentialProps_group_counter != 0) && (iVar5 != 0)) {
                        reset_group_sequentialProps(in_RDX);
                      }
                      in_RDX->sequentialProps_group_counter =
                           in_RDX->sequentialProps_group_counter + 1;
                      in_stack_fffffffffffffcf8 = (char *)0x0;
                      in_stack_fffffffffffffd00 = 0;
                      in_stack_fffffffffffffd30 = 0x2d;
                      in_stack_fffffffffffffd08 = iVar2;
                      in_stack_fffffffffffffd38 = in_R8;
                      iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                                         in_stack_fffffffffffffe60);
                    }
                    else {
                      iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"fluxOut");
                      if (iVar4 == 0) {
                        if ((in_RDX->sequentialProps_group_counter != 0) && (iVar5 != 0)) {
                          reset_group_sequentialProps(in_RDX);
                        }
                        in_RDX->sequentialProps_group_counter =
                             in_RDX->sequentialProps_group_counter + 1;
                        in_stack_fffffffffffffcf8 = (char *)0x0;
                        in_stack_fffffffffffffd00 = 0;
                        in_stack_fffffffffffffd30 = 0x2d;
                        in_stack_fffffffffffffd08 = iVar2;
                        in_stack_fffffffffffffd38 = in_R8;
                        iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                                           in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                           in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                                           in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                                           in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                                           in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                                           in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                                           in_stack_fffffffffffffe60);
                      }
                      else {
                        iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"ca1");
                        if (iVar4 == 0) {
                          if ((in_RDX->sequentialProps_group_counter != 0) && (iVar5 != 0)) {
                            reset_group_sequentialProps(in_RDX);
                          }
                          in_RDX->sequentialProps_group_counter =
                               in_RDX->sequentialProps_group_counter + 1;
                          in_stack_fffffffffffffcf8 = (char *)0x0;
                          in_stack_fffffffffffffd00 = 0;
                          in_stack_fffffffffffffd30 = 0x2d;
                          in_stack_fffffffffffffd08 = iVar2;
                          in_stack_fffffffffffffd38 = in_R8;
                          iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                                             in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                             in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                                             in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                                             in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                                             in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                                             in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                                             in_stack_fffffffffffffe60);
                        }
                        else {
                          iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"ca2");
                          if (iVar4 == 0) {
                            if ((in_RDX->sequentialProps_group_counter != 0) && (iVar5 != 0)) {
                              reset_group_sequentialProps(in_RDX);
                            }
                            in_RDX->sequentialProps_group_counter =
                                 in_RDX->sequentialProps_group_counter + 1;
                            in_stack_fffffffffffffcf8 = (char *)0x0;
                            in_stack_fffffffffffffd00 = 0;
                            in_stack_fffffffffffffd30 = 0x2d;
                            in_stack_fffffffffffffd08 = iVar2;
                            in_stack_fffffffffffffd38 = in_R8;
                            iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                                               in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                                               in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                                               in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                                               in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                                               in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                                               in_stack_fffffffffffffe60);
                          }
                          else {
                            iVar4 = strcmp(cmdline_parser_internal::long_options[0].name,"gcn");
                            if (iVar4 != 0) goto LAB_00142add;
                            if ((in_RDX->sequentialProps_group_counter != 0) && (iVar5 != 0)) {
                              reset_group_sequentialProps(in_RDX);
                            }
                            in_RDX->sequentialProps_group_counter =
                                 in_RDX->sequentialProps_group_counter + 1;
                            in_stack_fffffffffffffcf8 = (char *)0x0;
                            in_stack_fffffffffffffd00 = 0;
                            in_stack_fffffffffffffd30 = 0x2d;
                            in_stack_fffffffffffffd08 = iVar2;
                            in_stack_fffffffffffffd38 = in_R8;
                            iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                                               in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                                               in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                                               in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                                               in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                                               in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                                               in_stack_fffffffffffffe60);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    default:
      local_2a0 = in_R8;
      if (in_R8 == (gengetopt_args_info *)0x0) {
        local_2a0 = (gengetopt_args_info *)0x30744a;
      }
      fprintf(_stderr,"%s: option unknown: %c%s\n","SequentialProps",(ulong)uVar3,local_2a0);
      abort();
    case 0x3f:
      goto LAB_00144176;
    case 0x56:
      cmdline_parser_print_version();
      cmdline_parser_free((gengetopt_args_info *)0x142bf0);
      exit(0);
    case 0x62:
      in_stack_fffffffffffffcf8 = "100";
      in_stack_fffffffffffffd00 = 2;
      in_stack_fffffffffffffd30 = 0x62;
      in_stack_fffffffffffffd08 = iVar2;
      in_stack_fffffffffffffd38 = in_R8;
      iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe60);
      break;
    case 99:
      if ((in_RDX->sequentialProps_group_counter != 0) && (iVar5 != 0)) {
        reset_group_sequentialProps(in_RDX);
      }
      in_RDX->sequentialProps_group_counter = in_RDX->sequentialProps_group_counter + 1;
      in_stack_fffffffffffffcf8 = (char *)0x0;
      in_stack_fffffffffffffd00 = 0;
      in_stack_fffffffffffffd30 = 99;
      in_stack_fffffffffffffd08 = iVar2;
      in_stack_fffffffffffffd38 = in_R8;
      iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe60);
      break;
    case 0x68:
      cmdline_parser_print_help();
      cmdline_parser_free((gengetopt_args_info *)0x142bd7);
      exit(0);
    case 0x69:
      in_stack_fffffffffffffcf8 = (char *)0x0;
      in_stack_fffffffffffffd00 = 1;
      in_stack_fffffffffffffd30 = 0x69;
      in_stack_fffffffffffffd08 = iVar2;
      in_stack_fffffffffffffd38 = in_R8;
      iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe60);
      break;
    case 0x6f:
      in_stack_fffffffffffffcf8 = (char *)0x0;
      in_stack_fffffffffffffd00 = 1;
      in_stack_fffffffffffffd30 = 0x6f;
      in_stack_fffffffffffffd08 = iVar2;
      in_stack_fffffffffffffd38 = in_R8;
      iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe60);
      break;
    case 0x72:
      in_stack_fffffffffffffcf8 = (char *)0x0;
      in_stack_fffffffffffffd00 = 3;
      in_stack_fffffffffffffd30 = 0x72;
      in_stack_fffffffffffffd08 = iVar2;
      in_stack_fffffffffffffd38 = in_R8;
      iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe60);
      break;
    case 0x74:
      if ((in_RDX->sequentialProps_group_counter != 0) && (iVar5 != 0)) {
        reset_group_sequentialProps(in_RDX);
      }
      in_RDX->sequentialProps_group_counter = in_RDX->sequentialProps_group_counter + 1;
      in_stack_fffffffffffffcf8 = (char *)0x0;
      in_stack_fffffffffffffd00 = 0;
      in_stack_fffffffffffffd30 = 0x74;
      in_stack_fffffffffffffd08 = iVar2;
      in_stack_fffffffffffffd38 = in_R8;
      iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe60);
      break;
    case 0x76:
      if ((in_RDX->sequentialProps_group_counter != 0) && (iVar5 != 0)) {
        reset_group_sequentialProps(in_RDX);
      }
      in_RDX->sequentialProps_group_counter = in_RDX->sequentialProps_group_counter + 1;
      in_stack_fffffffffffffcf8 = (char *)0x0;
      in_stack_fffffffffffffd00 = 0;
      in_stack_fffffffffffffd30 = 0x76;
      in_stack_fffffffffffffd08 = iVar2;
      in_stack_fffffffffffffd38 = in_R8;
      iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe60);
      break;
    case 0x78:
      in_stack_fffffffffffffcf8 = (char *)0x0;
      in_stack_fffffffffffffd00 = 3;
      in_stack_fffffffffffffd30 = 0x78;
      in_stack_fffffffffffffd08 = iVar2;
      in_stack_fffffffffffffd38 = in_R8;
      iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe60);
      break;
    case 0x79:
      in_stack_fffffffffffffcf8 = (char *)0x0;
      in_stack_fffffffffffffd00 = 3;
      in_stack_fffffffffffffd30 = 0x79;
      in_stack_fffffffffffffd08 = iVar2;
      in_stack_fffffffffffffd38 = in_R8;
      iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe60);
      break;
    case 0x7a:
      in_stack_fffffffffffffcf8 = (char *)0x0;
      in_stack_fffffffffffffd00 = 3;
      in_stack_fffffffffffffd30 = 0x7a;
      in_stack_fffffffffffffd08 = iVar2;
      in_stack_fffffffffffffd38 = in_R8;
      iVar4 = update_arg(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe60);
    }
    if (iVar4 != 0) {
LAB_00144176:
      cmdline_parser_release
                ((gengetopt_args_info *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      return 1;
    }
  } while( true );
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  /* TODO: Why is this here? It is not used anywhere. */
  override = params->override;
  FIX_UNUSED(override);

  initialize = params->initialize;
  check_required = params->check_required;

  /* TODO: Why is this here? It is not used anywhere. */
  check_ambiguity = params->check_ambiguity;
  FIX_UNUSED(check_ambiguity);

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "input",	1, NULL, 'i' },
        { "output",	1, NULL, 'o' },
        { "sele1",	1, NULL, 0 },
        { "sele2",	1, NULL, 0 },
        { "nbins",	1, NULL, 'b' },
        { "nbins_z",	1, NULL, 0 },
        { "privilegedAxis",	1, NULL, 0 },
        { "centroidX",	1, NULL, 'x' },
        { "centroidY",	1, NULL, 'y' },
        { "referenceZ",	1, NULL, 'z' },
        { "dropletR",	1, NULL, 'r' },
        { "threshDens",	1, NULL, 0 },
        { "bufferLength",	1, NULL, 0 },
        { "rcut",	1, NULL, 0 },
        { "com",	0, NULL, 'c' },
        { "comvel",	0, NULL, 'v' },
        { "deltaCount",	0, NULL, 0 },
        { "fluxOut",	0, NULL, 0 },
        { "ca1",	0, NULL, 0 },
        { "ca2",	0, NULL, 0 },
        { "gcn",	0, NULL, 0 },
        { "testequi",	0, NULL, 't' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVi:o:b:x:y:z:r:cvt", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'i':	/* input dump file.  */
        
        
          if (update_arg( (void *)&(args_info->input_arg), 
               &(args_info->input_orig), &(args_info->input_given),
              &(local_args_info.input_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "input", 'i',
              additional_error))
            goto failure;
        
          break;
        case 'o':	/* output file name.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;
        case 'b':	/* number of bins (general purpose).  */
        
        
          if (update_arg( (void *)&(args_info->nbins_arg), 
               &(args_info->nbins_orig), &(args_info->nbins_given),
              &(local_args_info.nbins_given), optarg, 0, "100", ARG_INT,
              check_ambiguity, override, 0, 0,
              "nbins", 'b',
              additional_error))
            goto failure;
        
          break;
        case 'x':	/* Location of droplet centroid in x.  */
        
        
          if (update_arg( (void *)&(args_info->centroidX_arg), 
               &(args_info->centroidX_orig), &(args_info->centroidX_given),
              &(local_args_info.centroidX_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "centroidX", 'x',
              additional_error))
            goto failure;
        
          break;
        case 'y':	/* Location of droplet centroid in y.  */
        
        
          if (update_arg( (void *)&(args_info->centroidY_arg), 
               &(args_info->centroidY_orig), &(args_info->centroidY_given),
              &(local_args_info.centroidY_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "centroidY", 'y',
              additional_error))
            goto failure;
        
          break;
        case 'z':	/* Reference z-height of solid surface.  */
        
        
          if (update_arg( (void *)&(args_info->referenceZ_arg), 
               &(args_info->referenceZ_orig), &(args_info->referenceZ_given),
              &(local_args_info.referenceZ_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "referenceZ", 'z',
              additional_error))
            goto failure;
        
          break;
        case 'r':	/* Droplet radius in angstroms.  */
        
        
          if (update_arg( (void *)&(args_info->dropletR_arg), 
               &(args_info->dropletR_orig), &(args_info->dropletR_given),
              &(local_args_info.dropletR_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "dropletR", 'r',
              additional_error))
            goto failure;
        
          break;
        case 'c':	/* selection center of mass.  */
        
          if (args_info->sequentialProps_group_counter && override)
            reset_group_sequentialProps (args_info);
          args_info->sequentialProps_group_counter += 1;
        
          if (update_arg( 0 , 
               0 , &(args_info->com_given),
              &(local_args_info.com_given), optarg, 0, 0, ARG_NO,
              check_ambiguity, override, 0, 0,
              "com", 'c',
              additional_error))
            goto failure;
        
          break;
        case 'v':	/* selection center of mass velocity.  */
        
          if (args_info->sequentialProps_group_counter && override)
            reset_group_sequentialProps (args_info);
          args_info->sequentialProps_group_counter += 1;
        
          if (update_arg( 0 , 
               0 , &(args_info->comvel_given),
              &(local_args_info.comvel_given), optarg, 0, 0, ARG_NO,
              check_ambiguity, override, 0, 0,
              "comvel", 'v',
              additional_error))
            goto failure;
        
          break;
        case 't':	/* Temperature using all componets of linear and angular momentum.  */
        
          if (args_info->sequentialProps_group_counter && override)
            reset_group_sequentialProps (args_info);
          args_info->sequentialProps_group_counter += 1;
        
          if (update_arg( 0 , 
               0 , &(args_info->testequi_given),
              &(local_args_info.testequi_given), optarg, 0, 0, ARG_NO,
              check_ambiguity, override, 0, 0,
              "testequi", 't',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* select first stuntdouble set.  */
          if (strcmp (long_options[option_index].name, "sele1") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->sele1_arg), 
                 &(args_info->sele1_orig), &(args_info->sele1_given),
                &(local_args_info.sele1_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "sele1", '-',
                additional_error))
              goto failure;
          
          }
          /* select second stuntdouble set (if sele2 is not set, use script from sele1).  */
          else if (strcmp (long_options[option_index].name, "sele2") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->sele2_arg), 
                 &(args_info->sele2_orig), &(args_info->sele2_given),
                &(local_args_info.sele2_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "sele2", '-',
                additional_error))
              goto failure;
          
          }
          /* number of bins in z axis.  */
          else if (strcmp (long_options[option_index].name, "nbins_z") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->nbins_z_arg), 
                 &(args_info->nbins_z_orig), &(args_info->nbins_z_given),
                &(local_args_info.nbins_z_given), optarg, 0, "100", ARG_INT,
                check_ambiguity, override, 0, 0,
                "nbins_z", '-',
                additional_error))
              goto failure;
          
          }
          /* which axis is special for spatial analysis (default = z axis).  */
          else if (strcmp (long_options[option_index].name, "privilegedAxis") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->privilegedAxis_arg), 
                 &(args_info->privilegedAxis_orig), &(args_info->privilegedAxis_given),
                &(local_args_info.privilegedAxis_given), optarg, cmdline_parser_privilegedAxis_values, "z", ARG_ENUM,
                check_ambiguity, override, 0, 0,
                "privilegedAxis", '-',
                additional_error))
              goto failure;
          
          }
          /* Threshold Density in g/cm^3.  */
          else if (strcmp (long_options[option_index].name, "threshDens") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->threshDens_arg), 
                 &(args_info->threshDens_orig), &(args_info->threshDens_given),
                &(local_args_info.threshDens_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "threshDens", '-',
                additional_error))
              goto failure;
          
          }
          /* Buffer length in angstroms.  */
          else if (strcmp (long_options[option_index].name, "bufferLength") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->bufferLength_arg), 
                 &(args_info->bufferLength_orig), &(args_info->bufferLength_given),
                &(local_args_info.bufferLength_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "bufferLength", '-',
                additional_error))
              goto failure;
          
          }
          /* cutoff radius (rcut).  */
          else if (strcmp (long_options[option_index].name, "rcut") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->rcut_arg), 
                 &(args_info->rcut_orig), &(args_info->rcut_given),
                &(local_args_info.rcut_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "rcut", '-',
                additional_error))
              goto failure;
          
          }
          /* difference in counts between two selections.  */
          else if (strcmp (long_options[option_index].name, "deltaCount") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->deltaCount_given),
                &(local_args_info.deltaCount_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "deltaCount", '-',
                additional_error))
              goto failure;
          
          }
          /* number flux out of a selection.  */
          else if (strcmp (long_options[option_index].name, "fluxOut") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->fluxOut_given),
                &(local_args_info.fluxOut_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "fluxOut", '-',
                additional_error))
              goto failure;
          
          }
          /* contact angle of selection (using center of mass).  */
          else if (strcmp (long_options[option_index].name, "ca1") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->ca1_given),
                &(local_args_info.ca1_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "ca1", '-',
                additional_error))
              goto failure;
          
          }
          /* contact angle of selection (using density profile).  */
          else if (strcmp (long_options[option_index].name, "ca2") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->ca2_given),
                &(local_args_info.ca2_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "ca2", '-',
                additional_error))
              goto failure;
          
          }
          /* Generalized Coordinate Number.  */
          else if (strcmp (long_options[option_index].name, "gcn") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->gcn_given),
                &(local_args_info.gcn_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "gcn", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */

  if (args_info->sequentialProps_group_counter > 1)
    {
      fprintf (stderr, "%s: %d options of group sequentialProps were given. One is required%s.\n", argv[0], args_info->sequentialProps_group_counter, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  


  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}